

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor_internal.h
# Opt level: O0

void __thiscall
absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
~StatusOrData(StatusOrData<google::protobuf::FeatureSetDefaults> *this)

{
  bool bVar1;
  StatusOrData<google::protobuf::FeatureSetDefaults> *this_local;
  
  bVar1 = ok(this);
  if (bVar1) {
    Status::~Status((Status *)this);
    google::protobuf::FeatureSetDefaults::~FeatureSetDefaults(&(this->field_1).data_);
  }
  else {
    Status::~Status((Status *)this);
  }
  return;
}

Assistant:

~StatusOrData() {
    if (ok()) {
      status_.~Status();
      data_.~T();
    } else {
      status_.~Status();
    }
  }